

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

XrFormFactor GetXrFormFactor(string *formFactorStr)

{
  XrFormFactor XVar1;
  bool bVar2;
  invalid_argument *this;
  allocator local_41;
  locale local_40 [8];
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Hmd",&local_41);
  std::locale::locale(local_40);
  bVar2 = EqualsIgnoreCase(formFactorStr,&local_38,local_40);
  std::locale::~locale(local_40);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar2) {
    XVar1 = XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"Handheld",&local_41);
    std::locale::locale(local_40);
    bVar2 = EqualsIgnoreCase(formFactorStr,&local_38,local_40);
    std::locale::~locale(local_40);
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      Fmt_abi_cxx11_(&local_38,"Unknown form factor \'%s\'",(formFactorStr->_M_dataplus)._M_p);
      std::invalid_argument::invalid_argument(this,(string *)&local_38);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    XVar1 = XR_FORM_FACTOR_HANDHELD_DISPLAY;
  }
  return XVar1;
}

Assistant:

inline XrFormFactor GetXrFormFactor(const std::string& formFactorStr) {
    if (EqualsIgnoreCase(formFactorStr, "Hmd")) {
        return XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
    }
    if (EqualsIgnoreCase(formFactorStr, "Handheld")) {
        return XR_FORM_FACTOR_HANDHELD_DISPLAY;
    }
    throw std::invalid_argument(Fmt("Unknown form factor '%s'", formFactorStr.c_str()));
}